

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusPoly.cpp
# Opt level: O2

void __thiscall
ZXing::Pdf417::ModulusPoly::divide
          (ModulusPoly *this,ModulusPoly *other,ModulusPoly *quotient,ModulusPoly *remainder)

{
  ModulusGF *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  invalid_argument *this_01;
  int degree;
  ModulusPoly term;
  ModulusPoly local_70;
  ModulusPoly iterationQuotient;
  
  if (this->_field == other->_field) {
    bVar1 = isZero(other);
    if (!bVar1) {
      operator=(quotient,&this->_field->_zero);
      operator=(remainder,this);
      iVar2 = coefficient(other,(int)((ulong)((long)(other->_coefficients).
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_finish -
                                             (long)(other->_coefficients).
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start) >> 2) +
                                -1);
      iVar2 = ModulusGF::inverse(this->_field,iVar2);
      while( true ) {
        if ((int)((ulong)((long)(remainder->_coefficients).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(remainder->_coefficients).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2) <
            (int)((ulong)((long)(other->_coefficients).super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(other->_coefficients).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2)) {
          return;
        }
        bVar1 = isZero(remainder);
        if (bVar1) break;
        iVar3 = (int)((ulong)((long)(remainder->_coefficients).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(remainder->_coefficients).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2);
        degree = iVar3 - (int)((ulong)((long)(other->_coefficients).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_finish -
                                      (long)(other->_coefficients).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start) >> 2);
        this_00 = this->_field;
        iVar3 = coefficient(remainder,iVar3 + -1);
        iVar3 = ModulusGF::multiply(this_00,iVar3,iVar2);
        multiplyByMonomial(&term,other,degree,iVar3);
        ModulusGF::buildMonomial(&iterationQuotient,this->_field,degree,iVar3);
        add(&local_70,quotient,&iterationQuotient);
        operator=(quotient,&local_70);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&local_70._coefficients.super__Vector_base<int,_std::allocator<int>_>);
        subtract(&local_70,remainder,&term);
        operator=(remainder,&local_70);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&local_70._coefficients.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&iterationQuotient._coefficients.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&term._coefficients.super__Vector_base<int,_std::allocator<int>_>);
      }
      return;
    }
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_01,"Divide by 0");
  }
  else {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_01,"ModulusPolys do not have same ModulusGF field")
    ;
  }
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
ModulusPoly::divide(const ModulusPoly& other, ModulusPoly& quotient, ModulusPoly& remainder) const
{
	if (_field != other._field) {
		throw std::invalid_argument("ModulusPolys do not have same ModulusGF field");
	}
	if (other.isZero()) {
		throw std::invalid_argument("Divide by 0");
	}

	quotient = _field->zero();
	remainder = *this;

	int denominatorLeadingTerm = other.coefficient(other.degree());
	int inverseDenominatorLeadingTerm = _field->inverse(denominatorLeadingTerm);

	while (remainder.degree() >= other.degree() && !remainder.isZero()) {
		int degreeDifference = remainder.degree() - other.degree();
		int scale = _field->multiply(remainder.coefficient(remainder.degree()), inverseDenominatorLeadingTerm);
		ModulusPoly term = other.multiplyByMonomial(degreeDifference, scale);
		ModulusPoly iterationQuotient = _field->buildMonomial(degreeDifference, scale);
		quotient = quotient.add(iterationQuotient);
		remainder = remainder.subtract(term);
	}
}